

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O0

bool RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *stack,size_t pos,vector<unsigned_int,_std::allocator<unsigned_int>_> *roots,
               bool fully_factorizable,int depth,Elem randv,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  long lVar1;
  bool bVar2;
  Elem EVar3;
  Elem EVar4;
  Elem EVar5;
  int iVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar10;
  reference this;
  reference __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar12;
  undefined1 in_CL;
  size_t in_RDX;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RSI;
  int in_R8D;
  long in_FS_OFFSET;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *unaff_retaddr;
  bool ret;
  size_t i;
  int iter;
  value_type *trace;
  value_type *tmp;
  value_type *poly;
  Elem root;
  Elem input;
  value_type *ppoly;
  Elem sol;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff18;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  value_type in_stack_ffffffffffffff2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *field_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_ffffffffffffff60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  int local_64;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar13;
  bool local_15;
  Elem in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = CONCAT13(in_CL,in_stack_ffffffffffffffcc) & 0x1ffffff;
  pvVar7 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[](in_stack_ffffffffffffff18,
                        CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff08);
  if (sVar8 == 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18,
               (value_type_conflict5 *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
              );
    local_15 = true;
  }
  else {
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffff08);
    if (sVar8 == 3) {
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff18,
                          CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      if (*pvVar9 == 0) {
        local_15 = false;
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18,
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18,
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        anon_unknown.dwarf_250df77::
        Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
        ::Inv(in_stack_ffffffffffffff08,0);
        anon_unknown.dwarf_250df77::
        Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
        ::Sqr(in_stack_ffffffffffffff08,0);
        EVar3 = anon_unknown.dwarf_250df77::
                Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                      (Elem)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                      (Elem)in_stack_ffffffffffffff18);
        EVar4 = anon_unknown.dwarf_250df77::
                Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                ::Qrt(in_stack_ffffffffffffff08,0);
        EVar5 = anon_unknown.dwarf_250df77::
                Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                ::Sqr(in_stack_ffffffffffffff08,0);
        if ((EVar5 ^ EVar4) == EVar3) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff18,
                     CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
          anon_unknown.dwarf_250df77::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                (Elem)((ulong)in_stack_ffffffffffffff18 >> 0x20),(Elem)in_stack_ffffffffffffff18);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff18,
                     (value_type_conflict5 *)
                     CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff18,
                     CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff08,(value_type_conflict5 *)0x1522120);
          local_15 = true;
        }
        else {
          local_15 = false;
        }
      }
    }
    else {
      field_00 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)((long)&(in_RSI->
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 3);
      pFVar10 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)in_stack_ffffffffffffff08);
      if (pFVar10 < field_00) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff2c,
                             CONCAT13(in_stack_ffffffffffffff2b,
                                      CONCAT12(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28))
                            ),(size_type)in_stack_ffffffffffffff20);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](in_stack_ffffffffffffff18,
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      this = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](in_stack_ffffffffffffff18,
                          CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      __x = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[](in_stack_ffffffffffffff18,
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff08);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff08);
      local_64 = 0;
      while( true ) {
        TraceMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)field_00,
                   in_stack_ffffffffffffff30,
                   (Elem *)CONCAT44(in_stack_ffffffffffffff2c,
                                    CONCAT13(in_stack_ffffffffffffff2b,
                                             CONCAT12(in_stack_ffffffffffffff2a,
                                                      in_stack_ffffffffffffff28))),
                   in_stack_ffffffffffffff20);
        if ((0 < local_64) && ((uVar13 & 0x1000000) == 0)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this,__x);
          Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff40);
          local_70 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          while (in_stack_ffffffffffffff30 = local_70,
                pvVar11 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_ffffffffffffff08), in_stack_ffffffffffffff30 < pvVar11
                ) {
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff18,
                                CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
            in_stack_ffffffffffffff2c = *pvVar9;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff18,
                                CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
            *pvVar9 = in_stack_ffffffffffffff2c ^ *pvVar9;
            local_70 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)&(local_70->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
          }
          while( true ) {
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff2b = false;
            if (sVar8 != 0) {
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffff08);
              in_stack_ffffffffffffff2b = *pvVar9 == 0;
            }
            if ((bool)in_stack_ffffffffffffff2b == false) break;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffff08);
          }
          PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff40,field_00);
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_stack_ffffffffffffff08);
          if (sVar8 != 0) {
            local_15 = false;
            goto LAB_015225bb;
          }
          uVar13 = CONCAT13(1,(int3)uVar13);
        }
        if ((uVar13 & 0x1000000) != 0) {
          iVar6 = anon_unknown.dwarf_250df77::
                  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  ::Bits(in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff2a = true;
          if (iVar6 - in_R8D < 0x40) {
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff20 =
                 (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)(sVar8 - 2);
            iVar6 = anon_unknown.dwarf_250df77::
                    Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    ::Bits(in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff2a =
                 (ulong)in_stack_ffffffffffffff20 >> ((char)iVar6 - (char)in_R8D & 0x3fU) == 0;
          }
          if (((in_stack_ffffffffffffff2a ^ 0xff) & 1) != 0) {
            local_15 = false;
            goto LAB_015225bb;
          }
        }
        in_R8D = in_R8D + 1;
        anon_unknown.dwarf_250df77::
        Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
        ::Mul2((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (Elem)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this,__x);
        GCD<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff18 =
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_ffffffffffffff08);
        pvVar12 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff08);
        if ((in_stack_ffffffffffffff18 != pvVar12) &&
           (sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               in_stack_ffffffffffffff08), 1 < sVar8)) break;
        local_64 = local_64 + 1;
      }
      MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                (in_stack_ffffffffffffff30,
                 (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)CONCAT44(in_stack_ffffffffffffff2c,
                             CONCAT13(in_stack_ffffffffffffff2b,
                                      CONCAT12(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28))
                            ));
      DivMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::swap<unsigned_int,std::allocator<unsigned_int>>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff08,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x152250c);
      bVar2 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                        (in_RSI,in_RDX,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar13,in_R8D),SUB81((ulong)pvVar7 >> 0x38,0),(int)pvVar7,
                         in_stack_ffffffffffffffec,unaff_retaddr);
      if (bVar2) {
        local_15 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                             (in_RSI,in_RDX,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              CONCAT44(uVar13,in_R8D),SUB81((ulong)pvVar7 >> 0x38,0),(int)pvVar7,
                              in_stack_ffffffffffffffec,unaff_retaddr);
      }
      else {
        local_15 = false;
      }
    }
  }
LAB_015225bb:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_15;
}

Assistant:

bool RecFindRoots(std::vector<std::vector<typename F::Elem>>& stack, size_t pos, std::vector<typename F::Elem>& roots, bool fully_factorizable, int depth, typename F::Elem randv, const F& field) {
    auto& ppoly = stack[pos];
    // We assert ppoly.size() > 1 (instead of just ppoly.size() > 0) to additionally exclude
    // constants polynomials because
    //  - ppoly is not constant initially (this is ensured by FindRoots()), and
    //  - we never recurse on a constant polynomial.
    CHECK_SAFE(ppoly.size() > 1 && ppoly.back() == 1);
    /* 1st degree input: constant term is the root. */
    if (ppoly.size() == 2) {
        roots.push_back(ppoly[0]);
        return true;
    }
    /* 2nd degree input: use direct quadratic solver. */
    if (ppoly.size() == 3) {
        CHECK_RETURN(ppoly[1] != 0, false); // Equations of the form (x^2 + a) have two identical solutions; contradicts square-free assumption. */
        auto input = field.Mul(ppoly[0], field.Sqr(field.Inv(ppoly[1])));
        auto root = field.Qrt(input);
        if ((field.Sqr(root) ^ root) != input) {
            CHECK_SAFE(!fully_factorizable);
            return false; // No root found.
        }
        auto sol = field.Mul(root, ppoly[1]);
        roots.push_back(sol);
        roots.push_back(sol ^ ppoly[1]);
        return true;
    }
    /* 3rd degree input and more: recurse further. */
    if (pos + 3 > stack.size()) {
        // Allocate memory if necessary.
        stack.resize((pos + 3) * 2);
    }
    auto& poly = stack[pos];
    auto& tmp = stack[pos + 1];
    auto& trace = stack[pos + 2];
    trace.clear();
    tmp.clear();
    for (int iter = 0;; ++iter) {
        // Compute the polynomial (trace(x*randv) mod poly(x)) symbolically,
        // and put the result in `trace`.
        TraceMod(poly, trace, randv, field);

        if (iter >= 1 && !fully_factorizable) {
            // If the polynomial cannot be factorized completely (it has an
            // irreducible factor of degree higher than 1), we want to avoid
            // the case where this is only detected after trying all BITS
            // independent split attempts fail (see the assert below).
            //
            // Observe that if we call y = randv*x, it is true that:
            //
            //   trace = y + y^2 + y^4 + y^8 + ... y^(FIELDSIZE/2) mod poly
            //
            // Due to the Frobenius endomorphism, this means:
            //
            //   trace^2 = y^2 + y^4 + y^8 + ... + y^FIELDSIZE mod poly
            //
            // Or, adding them up:
            //
            //   trace + trace^2 = y + y^FIELDSIZE mod poly.
            //                   = randv*x + randv^FIELDSIZE*x^FIELDSIZE
            //                   = randv*x + randv*x^FIELDSIZE
            //                   = randv*(x + x^FIELDSIZE).
            //     (all mod poly)
            //
            // x + x^FIELDSIZE is the polynomial which has every field element
            // as root once. Whenever x + x^FIELDSIZE is multiple of poly,
            // this means it only has unique first degree factors. The same
            // holds for its constant multiple randv*(x + x^FIELDSIZE) =
            // trace + trace^2.
            //
            // We use this test to quickly verify whether the polynomial is
            // fully factorizable after already having computed a trace.
            // We don't invoke it immediately; only when splitting has failed
            // at least once, which avoids it for most polynomials that are
            // fully factorizable (or at least pushes the test down the
            // recursion to factors which are smaller and thus faster).
            tmp = trace;
            Sqr(tmp, field);
            for (size_t i = 0; i < trace.size(); ++i) {
                tmp[i] ^= trace[i];
            }
            while (tmp.size() && tmp.back() == 0) tmp.pop_back();
            PolyMod(poly, tmp, field);

            // Whenever the test fails, we can immediately abort the root
            // finding. Whenever it succeeds, we can remember and pass down
            // the information that it is in fact fully factorizable, avoiding
            // the need to run the test again.
            if (tmp.size() != 0) return false;
            fully_factorizable = true;
        }

        if (fully_factorizable) {
            // Every successful iteration of this algorithm splits the input
            // polynomial further into buckets, each corresponding to a subset
            // of 2^(BITS-depth) roots. If after depth splits the degree of
            // the polynomial is >= 2^(BITS-depth), something is wrong.
            CHECK_RETURN(field.Bits() - depth >= std::numeric_limits<decltype(poly.size())>::digits ||
                (poly.size() - 2) >> (field.Bits() - depth) == 0, false);
        }

        depth++;
        // In every iteration we multiply randv by 2. As a result, the set
        // of randv values forms a GF(2)-linearly independent basis of splits.
        randv = field.Mul2(randv);
        tmp = poly;
        GCD(trace, tmp, field);
        if (trace.size() != poly.size() && trace.size() > 1) break;
    }
    MakeMonic(trace, field);
    DivMod(trace, poly, tmp, field);
    // At this point, the stack looks like [... (poly) tmp trace], and we want to recursively
    // find roots of trace and tmp (= poly/trace). As we don't care about poly anymore, move
    // trace into its position first.
    std::swap(poly, trace);
    // Now the stack is [... (trace) tmp ...]. First we factor tmp (at pos = pos+1), and then
    // we factor trace (at pos = pos).
    if (!RecFindRoots(stack, pos + 1, roots, fully_factorizable, depth, randv, field)) return false;
    // The stack position pos contains trace, the polynomial with all of poly's roots which (after
    // multiplication with randv) have trace 0. This is never the case for irreducible factors
    // (which always end up in tmp), so we can set fully_factorizable to true when recursing.
    bool ret = RecFindRoots(stack, pos, roots, true, depth, randv, field);
    // Because of the above, recursion can never fail here.
    CHECK_SAFE(ret);
    return ret;
}